

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlAddChild(xmlNodePtr parent,xmlNodePtr cur)

{
  xmlNodePtr pxVar1;
  int iVar2;
  xmlNodePtr pxVar3;
  
  if (((parent != (xmlNodePtr)0x0) && (cur != (xmlNodePtr)0x0 && parent->type != XML_NAMESPACE_DECL)
      ) && (parent != cur && cur->type != XML_NAMESPACE_DECL)) {
    if (parent->type != XML_TEXT_NODE) {
      if (cur->type == XML_ATTRIBUTE_NODE) {
        pxVar1 = (xmlNodePtr)parent->properties;
        if ((xmlNodePtr)parent->properties == (xmlNodePtr)0x0) {
          pxVar3 = (xmlNodePtr)0x0;
        }
        else {
          do {
            pxVar3 = pxVar1;
            pxVar1 = pxVar3->next;
          } while (pxVar3->next != (_xmlNode *)0x0);
        }
      }
      else {
        pxVar3 = parent->last;
      }
      if (pxVar3 == cur) {
        return cur;
      }
      pxVar3 = xmlInsertNode(parent->doc,cur,parent,pxVar3,(xmlNodePtr)0x0,1);
      return pxVar3;
    }
    iVar2 = xmlTextAddContent(parent,cur->content,-1);
    if (-1 < iVar2) {
      xmlFreeNode(cur);
      return parent;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlAddChild(xmlNodePtr parent, xmlNodePtr cur) {
    xmlNodePtr prev;

    if ((parent == NULL) || (parent->type == XML_NAMESPACE_DECL) ||
        (cur == NULL) || (cur->type == XML_NAMESPACE_DECL) ||
        (parent == cur))
        return(NULL);

    /*
     * If parent is a text node, call xmlTextAddContent. This
     * undocumented quirk should probably be removed.
     */
    if (parent->type == XML_TEXT_NODE) {
        if (xmlTextAddContent(parent, cur->content, -1) < 0)
            return(NULL);
        xmlFreeNode(cur);
        return(parent);
    }

    if (cur->type == XML_ATTRIBUTE_NODE) {
        prev = (xmlNodePtr) parent->properties;
        if (prev != NULL) {
            while (prev->next != NULL)
                prev = prev->next;
        }
    } else {
        prev = parent->last;
    }

    if (cur == prev)
        return(cur);

    return(xmlInsertNode(parent->doc, cur, parent, prev, NULL, 1));
}